

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O3

bool VCXProjectWriter::outputFileConfig
               (OutputFilterData *d,XmlOutput *xml,XmlOutput *xmlFilter,QString *filename,
               QString *fullFilterName,bool fileAdded,bool hasCustomBuildStep)

{
  QString *pQVar1;
  int iVar2;
  bool bVar3;
  pchOption pVar4;
  VCProjectWriter *pVVar5;
  QString str;
  QString string;
  QString string_00;
  QArrayData *pQVar6;
  QArrayData *pQVar7;
  undefined8 uVar8;
  char16_t *pcVar9;
  undefined1 auVar10 [16];
  char cVar11;
  byte bVar12;
  char cVar13;
  XmlOutput *pXVar14;
  Data *pDVar15;
  undefined1 auVar16 [8];
  storage_type *psVar17;
  long in_FS_OFFSET;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  undefined8 in_stack_fffffffffffffea0;
  OutputFilterData *pOVar45;
  QString local_148;
  undefined1 local_128 [8];
  undefined1 auStack_120 [16];
  char16_t *pcStack_110;
  QArrayData *pQStack_108;
  char16_t *pcStack_100;
  qsizetype local_f8;
  xml_output local_e8;
  undefined1 local_a8 [8];
  undefined1 auStack_a0 [16];
  undefined1 auStack_90 [16];
  undefined1 auStack_80 [16];
  QArrayData *local_70;
  char16_t *local_68;
  qsizetype local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (d->inBuild == true) {
    if (((d->filter).Project)->usePCH == true) {
      local_70 = &((filename->d).d)->super_QArrayData;
      local_68 = (filename->d).ptr;
      local_60 = (filename->d).size;
      if (local_70 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&local_70->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&local_70->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      str.d.ptr = (char16_t *)in_stack_fffffffffffffea0;
      str.d.d = (Data *)xml;
      str.d.size = (qsizetype)fullFilterName;
      VCFilter::modifyPCHstage(&d->filter,str);
      if (local_70 != (QArrayData *)0x0) {
        LOCK();
        (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_70,2,0x10);
        }
      }
    }
  }
  else if ((d->info).excludeFromBuild == true) {
    (d->filter).useCompilerTool = true;
  }
  pOVar45 = d;
  if (hasCustomBuildStep) {
LAB_002067ec:
    if (!fileAdded) {
      QVar19.m_data = (storage_type *)0xb;
      QVar19.m_size = (qsizetype)local_a8;
      QString::fromUtf8(QVar19);
      pQVar6 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
      auStack_90._0_8_ = auStack_a0._8_8_;
      local_a8._0_4_ = tTag;
      auStack_a0._8_8_ = auStack_a0._0_8_;
      auStack_a0._0_8_ = pQVar6;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      auStack_90._8_8_ = 0;
      auStack_80 = ZEXT816(0);
      pXVar14 = XmlOutput::operator<<(xmlFilter,(xml_output *)local_a8);
      QVar20.m_data = (storage_type *)0x7;
      QVar20.m_size = (qsizetype)&local_e8;
      QString::fromUtf8(QVar20);
      pcVar9 = local_e8.xo_text.d.ptr;
      pDVar15 = local_e8.xo_text.d.d;
      uVar8 = local_e8._0_8_;
      local_e8._0_8_ = (filename->d).d;
      local_e8.xo_text.d.d = (Data *)(filename->d).ptr;
      local_e8.xo_text.d.ptr = (char16_t *)(filename->d).size;
      if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_e8._0_8_)->ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((QArrayData *)local_e8._0_8_)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      string.d.ptr = (char16_t *)pOVar45;
      string.d.d = (Data *)xml;
      string.d.size = (qsizetype)fullFilterName;
      Option::fixString(&local_58,string,(uchar)&local_e8);
      d = pOVar45;
      if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
          d = pOVar45;
        }
      }
      local_e8.xo_type = 8;
      local_e8.xo_text.d.d = (Data *)uVar8;
      local_e8.xo_text.d.ptr = (char16_t *)pDVar15;
      local_e8.xo_text.d.size = (qsizetype)pcVar9;
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_e8.xo_value.d.d = local_58.d.d;
      local_e8.xo_value.d.ptr = local_58.d.ptr;
      local_e8.xo_value.d.size = local_58.d.size;
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pXVar14 = XmlOutput::operator<<(pXVar14,&local_e8);
      if ((fullFilterName->d).size == 0) {
        local_128 = (undefined1  [8])((ulong)local_128 & 0xffffffff00000000);
        auStack_120 = ZEXT816(0);
        pcStack_110 = (char16_t *)0x0;
        pQStack_108 = (QArrayData *)0x0;
        pcStack_100 = (char16_t *)0x0;
        local_f8 = 0;
      }
      else {
        QVar21.m_data = (storage_type *)0x6;
        QVar21.m_size = (qsizetype)local_128;
        QString::fromUtf8(QVar21);
        auVar16 = local_128;
        pcStack_110 = (char16_t *)auStack_120._8_8_;
        local_128._0_4_ = 4;
        auStack_120._8_8_ = auStack_120._0_8_;
        auStack_120._0_8_ = auVar16;
        if (auVar16 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)auVar16)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)auVar16)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        pQStack_108 = &((fullFilterName->d).d)->super_QArrayData;
        pcStack_100 = (fullFilterName->d).ptr;
        local_f8 = (fullFilterName->d).size;
        if (pQStack_108 != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&pQStack_108->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)&pQStack_108->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1
          ;
          UNLOCK();
        }
        if (auVar16 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)auVar16)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)auVar16)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)auVar16)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)auVar16,2,0x10);
          }
        }
      }
      XmlOutput::operator<<(pXVar14,(xml_output *)local_128);
      if (pQStack_108 != (QArrayData *)0x0) {
        LOCK();
        (pQStack_108->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQStack_108->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQStack_108->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQStack_108,2,0x10);
        }
      }
      if ((QArrayData *)auStack_120._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_120._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_120._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_120._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_120._0_8_,2,0x10);
        }
      }
      if (&(local_e8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_e8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
        }
      }
      if ((QArrayData *)auStack_90._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_90._8_8_,2,0x10);
        }
      }
      if ((QArrayData *)auStack_a0._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_a0._0_8_,2,0x10);
        }
      }
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,2,0x10);
        }
      }
      QVar22.m_data = (storage_type *)0xb;
      QVar22.m_size = (qsizetype)local_a8;
      QString::fromUtf8(QVar22);
      pQVar6 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
      auStack_90._0_8_ = auStack_a0._8_8_;
      local_a8._0_4_ = tTag;
      auStack_a0._8_8_ = auStack_a0._0_8_;
      auStack_a0._0_8_ = pQVar6;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      auStack_90._8_8_ = 0;
      auStack_80 = ZEXT816(0);
      pXVar14 = XmlOutput::operator<<(xml,(xml_output *)local_a8);
      QVar23.m_data = (storage_type *)0x7;
      QVar23.m_size = (qsizetype)&local_e8;
      QString::fromUtf8(QVar23);
      pcVar9 = local_e8.xo_text.d.ptr;
      pDVar15 = local_e8.xo_text.d.d;
      uVar8 = local_e8._0_8_;
      local_e8._0_8_ = (filename->d).d;
      local_e8.xo_text.d.d = (Data *)(filename->d).ptr;
      local_e8.xo_text.d.ptr = (char16_t *)(filename->d).size;
      if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_e8._0_8_)->ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((QArrayData *)local_e8._0_8_)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      string_00.d.ptr = (char16_t *)d;
      string_00.d.d = (Data *)xml;
      string_00.d.size = (qsizetype)pXVar14;
      Option::fixString((QString *)local_128,string_00,(uchar)&local_e8);
      if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
        }
      }
      local_e8.xo_type = 8;
      local_e8.xo_text.d.d = (Data *)uVar8;
      local_e8.xo_text.d.ptr = (char16_t *)pDVar15;
      local_e8.xo_text.d.size = (qsizetype)pcVar9;
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_e8.xo_value.d.d = (Data *)local_128;
      local_e8.xo_value.d.ptr = (char16_t *)auStack_120._0_8_;
      local_e8.xo_value.d.size = auStack_120._8_8_;
      if (local_128 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_128)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_128)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      XmlOutput::operator<<(pXVar14,&local_e8);
      if (&(local_e8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_e8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_128 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_128)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_128)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_128)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_128,2,0x10);
        }
      }
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
        }
      }
      if ((QArrayData *)auStack_90._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_90._8_8_,2,0x10);
        }
      }
      pOVar45 = d;
      if ((QArrayData *)auStack_a0._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_a0._0_8_,2,0x10);
        }
      }
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,2,0x10);
        }
      }
      QVar24.m_data = (storage_type *)0xa;
      QVar24.m_size = (qsizetype)local_a8;
      QString::fromUtf8(QVar24);
      local_e8._0_8_ = CONCAT44(local_a8._4_4_,local_a8._0_4_);
      local_e8.xo_text.d.d = (Data *)auStack_a0._0_8_;
      local_e8.xo_text.d.ptr = (char16_t *)auStack_a0._8_8_;
      cVar11 = QString::startsWith((QString *)d,(CaseSensitivity)&local_e8);
      cVar13 = '\x01';
      if (cVar11 == '\0') {
        QVar25.m_data = (storage_type *)0xf;
        QVar25.m_size = (qsizetype)local_a8;
        QString::fromUtf8(QVar25);
        local_128 = (undefined1  [8])CONCAT44(local_a8._4_4_,local_a8._0_4_);
        auStack_120 = auStack_a0;
        cVar11 = QString::startsWith((QString *)d,(CaseSensitivity)local_128);
        cVar13 = '\x01';
        if (cVar11 == '\0') {
          QVar26.m_data = (storage_type *)0xe;
          QVar26.m_size = (qsizetype)local_a8;
          QString::fromUtf8(QVar26);
          local_58.d.d = (Data *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
          local_58.d.ptr = (char16_t *)auStack_a0._0_8_;
          local_58.d.size = auStack_a0._8_8_;
          cVar11 = QString::startsWith((QString *)d,(CaseSensitivity)&local_58);
          cVar13 = '\x01';
          if (cVar11 == '\0') {
            QVar27.m_data = (storage_type *)0x10;
            QVar27.m_size = (qsizetype)local_a8;
            QString::fromUtf8(QVar27);
            local_148.d.d = (Data *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
            local_148.d.ptr = (char16_t *)auStack_a0._0_8_;
            local_148.d.size = auStack_a0._8_8_;
            cVar13 = QString::startsWith((QString *)d,(CaseSensitivity)&local_148);
            if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        if (local_128 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_128)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_128)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_128)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_128,2,0x10);
          }
        }
      }
      if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
        }
      }
      if (cVar13 != '\0') {
        QVar28.m_data = &DAT_00000008;
        QVar28.m_size = (qsizetype)local_a8;
        QString::fromUtf8(QVar28);
        auVar10 = auStack_a0;
        pQVar6 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
        if ((char16_t *)auStack_a0._8_8_ == (char16_t *)0x0) {
          local_a8._0_4_ = tNothing;
          auStack_a0 = (undefined1  [16])0x0;
          auStack_90 = (undefined1  [16])0x0;
          auStack_80 = (undefined1  [16])0x0;
        }
        else {
          QVar29.m_data = &DAT_00000008;
          QVar29.m_size = (qsizetype)local_a8;
          QString::fromUtf8(QVar29);
          pQVar7 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
          auStack_90._0_8_ = auStack_a0._8_8_;
          local_a8._0_4_ = tTagValue;
          auStack_a0._8_8_ = auStack_a0._0_8_;
          auStack_a0._0_8_ = pQVar7;
          if (pQVar7 != (QArrayData *)0x0) {
            LOCK();
            (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          auStack_90._8_8_ = pQVar6;
          auStack_80 = auVar10;
          if (pQVar6 != (QArrayData *)0x0) {
            LOCK();
            (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          if (pQVar7 != (QArrayData *)0x0) {
            LOCK();
            (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar7,2,0x10);
            }
          }
        }
        XmlOutput::operator<<(xml,(xml_output *)local_a8);
        if ((QArrayData *)auStack_90._8_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)auStack_90._8_8_,2,0x10);
          }
        }
        if ((QArrayData *)auStack_a0._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)auStack_a0._0_8_,2,0x10);
          }
        }
        if (pQVar6 != (QArrayData *)0x0) {
          LOCK();
          (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar6,2,0x10);
          }
        }
      }
    }
    pVVar5 = ((d->filter).Project)->projectWriter;
    (*pVVar5->_vptr_VCProjectWriter[8])(pVVar5,xml,&(d->filter).CustomBuildTool);
  }
  else {
    bVar12 = (d->filter).useCustomBuildTool;
    if ((((bool)bVar12 == false) && ((d->filter).useCompilerTool == false)) && (d->inBuild == true))
    {
      QVar18.m_data = (storage_type *)0x10;
      QVar18.m_size = (qsizetype)local_a8;
      QString::fromUtf8(QVar18);
      local_e8._0_8_ = CONCAT44(local_a8._4_4_,local_a8._0_4_);
      local_e8.xo_text.d.d = (Data *)auStack_a0._0_8_;
      local_e8.xo_text.d.ptr = (char16_t *)auStack_a0._8_8_;
      cVar11 = QString::startsWith((QString *)d,(CaseSensitivity)&local_e8);
      if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
        }
      }
      if (cVar11 == '\0') goto LAB_00207f64;
      bVar12 = (d->filter).useCustomBuildTool;
    }
    if ((bVar12 & 1) != 0) goto LAB_002067ec;
    if (!fileAdded) {
      outputFileConfig(xml,xmlFilter,filename,fullFilterName);
    }
  }
  local_148.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_148.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_148.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  generateCondition(&local_148,(d->filter).Config);
  if (d->inBuild == false) {
    QVar30.m_data = (storage_type *)0x11;
    QVar30.m_size = (qsizetype)local_a8;
    QString::fromUtf8(QVar30);
    pQVar6 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
    auStack_90._0_8_ = auStack_a0._8_8_;
    local_a8._0_4_ = tTag;
    auStack_a0._8_8_ = auStack_a0._0_8_;
    auStack_a0._0_8_ = pQVar6;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_90._8_8_ = 0;
    auStack_80 = ZEXT816(0);
    pXVar14 = XmlOutput::operator<<(xml,(xml_output *)local_a8);
    QVar31.m_data = (storage_type *)0x9;
    QVar31.m_size = (qsizetype)&local_e8;
    QString::fromUtf8(QVar31);
    local_e8.xo_text.d.size = (qsizetype)local_e8.xo_text.d.ptr;
    local_e8.xo_text.d.ptr = (char16_t *)local_e8.xo_text.d.d;
    uVar8 = local_e8._0_8_;
    local_e8.xo_type = 8;
    local_e8.xo_text.d.d = (Data *)uVar8;
    if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_e8.xo_value.d.d = local_148.d.d;
    local_e8.xo_value.d.ptr = local_148.d.ptr;
    local_e8.xo_value.d.size = local_148.d.size;
    if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pXVar14 = XmlOutput::operator<<(pXVar14,&local_e8);
    QVar32.m_data = (storage_type *)0x4;
    QVar32.m_size = (qsizetype)local_128;
    QString::fromUtf8(QVar32);
    auVar16 = local_128;
    pcStack_110 = (char16_t *)auStack_120._8_8_;
    local_128._0_4_ = 5;
    auStack_120._8_8_ = auStack_120._0_8_;
    auStack_120._0_8_ = auVar16;
    if (auVar16 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)auVar16)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)auVar16)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQStack_108 = (QArrayData *)0x0;
    pcStack_100 = (char16_t *)0x0;
    local_f8 = 0;
    XmlOutput::operator<<(pXVar14,(xml_output *)local_128);
    d = pOVar45;
    if (pQStack_108 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_108->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_108->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_108->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_108,2,0x10);
        d = pOVar45;
      }
    }
    pOVar45 = d;
    if ((QArrayData *)auStack_120._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)auStack_120._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)auStack_120._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)auStack_120._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)auStack_120._0_8_,2,0x10);
      }
    }
    if (auVar16 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)auVar16)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)auVar16)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)auVar16)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)auVar16,2,0x10);
      }
    }
    if (&(local_e8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_e8.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_e8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_e8.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
      }
    }
    if ((QArrayData *)auStack_90._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)auStack_90._8_8_,2,0x10);
      }
    }
    if ((QArrayData *)auStack_a0._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)auStack_a0._0_8_,2,0x10);
      }
    }
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar6,2,0x10);
      }
    }
  }
  QVar33.m_data = (storage_type *)0x10;
  QVar33.m_size = (qsizetype)local_a8;
  QString::fromUtf8(QVar33);
  local_e8._0_8_ = CONCAT44(local_a8._4_4_,local_a8._0_4_);
  local_e8.xo_text.d.d = (Data *)auStack_a0._0_8_;
  local_e8.xo_text.d.ptr = (char16_t *)auStack_a0._8_8_;
  cVar11 = QString::startsWith((QString *)d,(CaseSensitivity)&local_e8);
  if (cVar11 == '\0') {
    if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      iVar2 = (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar6 = (QArrayData *)local_e8._0_8_;
joined_r0x0020769d:
      if (iVar2 == 0) {
        QArrayData::deallocate(pQVar6,2,0x10);
      }
    }
  }
  else {
    bVar3 = d->inBuild;
    if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
      }
    }
    if (bVar3 != false) {
      QVar34.m_data = (storage_type *)0x11;
      QVar34.m_size = (qsizetype)local_a8;
      QString::fromUtf8(QVar34);
      pQVar6 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
      auStack_90._0_8_ = auStack_a0._8_8_;
      local_a8._0_4_ = tTag;
      auStack_a0._8_8_ = auStack_a0._0_8_;
      auStack_a0._0_8_ = pQVar6;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      auStack_90._8_8_ = 0;
      auStack_80 = ZEXT816(0);
      pXVar14 = XmlOutput::operator<<(xml,(xml_output *)local_a8);
      QVar35.m_data = (storage_type *)0x9;
      QVar35.m_size = (qsizetype)&local_e8;
      QString::fromUtf8(QVar35);
      local_e8.xo_text.d.size = (qsizetype)local_e8.xo_text.d.ptr;
      local_e8.xo_text.d.ptr = (char16_t *)local_e8.xo_text.d.d;
      uVar8 = local_e8._0_8_;
      local_e8.xo_type = 8;
      local_e8.xo_text.d.d = (Data *)uVar8;
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_e8.xo_value.d.d = local_148.d.d;
      local_e8.xo_value.d.ptr = local_148.d.ptr;
      local_e8.xo_value.d.size = local_148.d.size;
      if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pXVar14 = XmlOutput::operator<<(pXVar14,&local_e8);
      QVar36.m_data = (storage_type *)0x4;
      QVar36.m_size = (qsizetype)local_128;
      QString::fromUtf8(QVar36);
      auVar16 = local_128;
      pcStack_110 = (char16_t *)auStack_120._8_8_;
      local_128._0_4_ = 5;
      auStack_120._8_8_ = auStack_120._0_8_;
      auStack_120._0_8_ = auVar16;
      if (auVar16 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)auVar16)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auVar16)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQStack_108 = (QArrayData *)0x0;
      pcStack_100 = (char16_t *)0x0;
      local_f8 = 0;
      XmlOutput::operator<<(pXVar14,(xml_output *)local_128);
      d = pOVar45;
      if (pQStack_108 != (QArrayData *)0x0) {
        LOCK();
        (pQStack_108->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQStack_108->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQStack_108->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQStack_108,2,0x10);
          d = pOVar45;
        }
      }
      pOVar45 = d;
      if ((QArrayData *)auStack_120._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_120._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_120._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_120._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_120._0_8_,2,0x10);
        }
      }
      if (auVar16 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)auVar16)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auVar16)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auVar16)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auVar16,2,0x10);
        }
      }
      if (&(local_e8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_e8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
        }
      }
      if ((QArrayData *)auStack_90._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_90._8_8_,2,0x10);
        }
      }
      if ((QArrayData *)auStack_a0._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_a0._0_8_,2,0x10);
        }
      }
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        iVar2 = (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i;
        UNLOCK();
        goto joined_r0x0020769d;
      }
    }
  }
  if ((d->filter).useCompilerTool == true) {
    if ((d->filter).CompilerTool.ForcedIncludeFiles.d.size != 0) {
      QVar37.m_data = (storage_type *)0x12;
      QVar37.m_size = (qsizetype)local_a8;
      QString::fromUtf8(QVar37);
      pQVar6 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
      auStack_90._0_8_ = auStack_a0._8_8_;
      local_a8._0_4_ = tTag;
      auStack_a0._8_8_ = auStack_a0._0_8_;
      auStack_a0._0_8_ = pQVar6;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      auStack_90._8_8_ = 0;
      auStack_80 = ZEXT816(0);
      pXVar14 = XmlOutput::operator<<(xml,(xml_output *)local_a8);
      QVar38.m_data = (storage_type *)0x9;
      QVar38.m_size = (qsizetype)&local_e8;
      d = pOVar45;
      QString::fromUtf8(QVar38);
      local_e8.xo_text.d.size = (qsizetype)local_e8.xo_text.d.ptr;
      local_e8.xo_text.d.ptr = (char16_t *)local_e8.xo_text.d.d;
      uVar8 = local_e8._0_8_;
      local_e8.xo_type = 8;
      local_e8.xo_text.d.d = (Data *)uVar8;
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_e8.xo_value.d.d = local_148.d.d;
      local_e8.xo_value.d.ptr = local_148.d.ptr;
      local_e8.xo_value.d.size = local_148.d.size;
      if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pOVar45 = d;
      pXVar14 = XmlOutput::operator<<(pXVar14,&local_e8);
      if ((d->filter).CompilerTool.ForcedIncludeFiles.d.size == 0) {
        local_128 = (undefined1  [8])((ulong)local_128 & 0xffffffff00000000);
        auStack_120 = (undefined1  [16])0x0;
        pcStack_110 = (char16_t *)0x0;
        pQStack_108 = (QArrayData *)0x0;
        pcStack_100 = (char16_t *)0x0;
        local_f8 = 0;
      }
      else {
        QVar39.m_data = (storage_type *)0x1;
        QVar39.m_size = (qsizetype)local_128;
        QString::fromUtf8(QVar39);
        auVar16 = local_128;
        pDVar15 = (Data *)auStack_120._0_8_;
        if ((Data *)auStack_120._0_8_ == (Data *)0x0) {
          pDVar15 = (Data *)&QString::_empty;
        }
        QtPrivate::QStringList_join
                  ((QList *)&local_58,(QChar *)&(d->filter).CompilerTool.ForcedIncludeFiles,
                   (longlong)pDVar15);
        local_128._0_4_ = 5;
        auStack_120._8_8_ = local_58.d.ptr;
        auStack_120._0_8_ = local_58.d.d;
        pcStack_110 = (char16_t *)local_58.d.size;
        d = pOVar45;
        if (&(local_58.d.d)->super_QArrayData == (QArrayData *)0x0) {
          pQStack_108 = (QArrayData *)0x0;
          pcStack_100 = (char16_t *)0x0;
          local_f8 = 0;
        }
        else {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          pQStack_108 = (QArrayData *)0x0;
          pcStack_100 = (char16_t *)0x0;
          local_f8 = 0;
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
              d = pOVar45;
            }
          }
        }
        pOVar45 = d;
        if (auVar16 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)auVar16)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)auVar16)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)auVar16)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)auVar16,2,0x10);
          }
        }
      }
      XmlOutput::operator<<(pXVar14,(xml_output *)local_128);
      if (pQStack_108 != (QArrayData *)0x0) {
        LOCK();
        (pQStack_108->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQStack_108->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQStack_108->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQStack_108,2,0x10);
        }
      }
      if ((QArrayData *)auStack_120._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_120._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_120._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_120._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_120._0_8_,2,0x10);
        }
      }
      if (&(local_e8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_e8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
        }
      }
      if ((QArrayData *)auStack_90._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_90._8_8_,2,0x10);
        }
      }
      if ((QArrayData *)auStack_a0._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_a0._0_8_,2,0x10);
        }
      }
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,2,0x10);
        }
      }
    }
    if ((d->filter).CompilerTool.PrecompiledHeaderThrough.d.size != 0) {
      QVar40.m_data = (storage_type *)0x15;
      QVar40.m_size = (qsizetype)local_a8;
      QString::fromUtf8(QVar40);
      pQVar6 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
      auStack_90._0_8_ = auStack_a0._8_8_;
      local_a8._0_4_ = tTag;
      auStack_a0._8_8_ = auStack_a0._0_8_;
      auStack_a0._0_8_ = pQVar6;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      auStack_90._8_8_ = 0;
      auStack_80 = ZEXT816(0);
      pXVar14 = XmlOutput::operator<<(xml,(xml_output *)local_a8);
      QVar41.m_data = (storage_type *)0x9;
      QVar41.m_size = (qsizetype)&local_e8;
      d = pOVar45;
      QString::fromUtf8(QVar41);
      local_e8.xo_text.d.size = (qsizetype)local_e8.xo_text.d.ptr;
      local_e8.xo_text.d.ptr = (char16_t *)local_e8.xo_text.d.d;
      uVar8 = local_e8._0_8_;
      local_e8.xo_type = 8;
      local_e8.xo_text.d.d = (Data *)uVar8;
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_e8.xo_value.d.d = local_148.d.d;
      local_e8.xo_value.d.ptr = local_148.d.ptr;
      local_e8.xo_value.d.size = local_148.d.size;
      if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pOVar45 = d;
      pXVar14 = XmlOutput::operator<<(pXVar14,&local_e8);
      local_128._0_4_ = 5;
      pQVar1 = &(d->filter).CompilerTool.PrecompiledHeaderThrough;
      pDVar15 = (pQVar1->d).d;
      auStack_120._0_8_ = (pQVar1->d).d;
      auStack_120._8_8_ = (pQVar1->d).ptr;
      pcStack_110 = (char16_t *)(d->filter).CompilerTool.PrecompiledHeaderThrough.d.size;
      if (pDVar15 != (Data *)0x0) {
        LOCK();
        (pDVar15->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar15->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQStack_108 = (QArrayData *)0x0;
      pcStack_100 = (char16_t *)0x0;
      local_f8 = 0;
      XmlOutput::operator<<(pXVar14,(xml_output *)local_128);
      if (pQStack_108 != (QArrayData *)0x0) {
        LOCK();
        (pQStack_108->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQStack_108->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQStack_108->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQStack_108,2,0x10);
        }
      }
      if ((QArrayData *)auStack_120._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_120._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_120._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_120._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_120._0_8_,2,0x10);
        }
      }
      if (&(local_e8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_e8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
        }
      }
      if ((QArrayData *)auStack_90._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_90._8_8_,2,0x10);
        }
      }
      if ((QArrayData *)auStack_a0._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_a0._0_8_,2,0x10);
        }
      }
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,2,0x10);
        }
      }
    }
    if ((d->filter).CompilerTool.UsePrecompiledHeader != pchUnset) {
      QVar42.m_data = (storage_type *)0x11;
      QVar42.m_size = (qsizetype)local_a8;
      QString::fromUtf8(QVar42);
      pQVar6 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
      auStack_90._0_8_ = auStack_a0._8_8_;
      local_a8._0_4_ = tTag;
      auStack_a0._8_8_ = auStack_a0._0_8_;
      auStack_a0._0_8_ = pQVar6;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      auStack_90._8_8_ = 0;
      auStack_80 = ZEXT816(0);
      pXVar14 = XmlOutput::operator<<(xml,(xml_output *)local_a8);
      QVar43.m_data = (storage_type *)0x9;
      QVar43.m_size = (qsizetype)&local_e8;
      QString::fromUtf8(QVar43);
      local_e8.xo_text.d.size = (qsizetype)local_e8.xo_text.d.ptr;
      local_e8.xo_text.d.ptr = (char16_t *)local_e8.xo_text.d.d;
      uVar8 = local_e8._0_8_;
      local_e8.xo_type = 8;
      local_e8.xo_text.d.d = (Data *)uVar8;
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_e8.xo_value.d.d = local_148.d.d;
      local_e8.xo_value.d.ptr = local_148.d.ptr;
      local_e8.xo_value.d.size = local_148.d.size;
      if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pXVar14 = XmlOutput::operator<<(pXVar14,&local_e8);
      pVar4 = (pOVar45->filter).CompilerTool.UsePrecompiledHeader;
      if (pVar4 == pchNone) {
        psVar17 = &DAT_00000008;
LAB_00207d89:
        QVar44.m_data = psVar17;
        QVar44.m_size = (qsizetype)local_128;
        QString::fromUtf8(QVar44);
        auVar16 = local_128;
        pcStack_110 = (char16_t *)auStack_120._8_8_;
        local_128._0_4_ = 5;
        auStack_120._8_8_ = auStack_120._0_8_;
        auStack_120._0_8_ = auVar16;
        if (auVar16 == (undefined1  [8])0x0) goto LAB_00207dd8;
        LOCK();
        (((QBasicAtomicInt *)auVar16)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auVar16)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
        bVar3 = false;
      }
      else {
        if (pVar4 == pchCreateUsingSpecific) {
          psVar17 = (storage_type *)0x6;
          goto LAB_00207d89;
        }
        if (pVar4 == pchUseUsingSpecific) {
          psVar17 = (storage_type *)0x3;
          goto LAB_00207d89;
        }
        local_128._0_4_ = 5;
        auStack_120 = (undefined1  [16])0x0;
        pcStack_110 = (char16_t *)0x0;
LAB_00207dd8:
        bVar3 = true;
        auVar16 = (undefined1  [8])0x0;
      }
      pQStack_108 = (QArrayData *)0x0;
      pcStack_100 = (char16_t *)0x0;
      local_f8 = 0;
      XmlOutput::operator<<(pXVar14,(xml_output *)local_128);
      if (pQStack_108 != (QArrayData *)0x0) {
        LOCK();
        (pQStack_108->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQStack_108->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQStack_108->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQStack_108,2,0x10);
        }
      }
      if ((QArrayData *)auStack_120._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_120._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_120._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_120._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_120._0_8_,2,0x10);
        }
      }
      if (!bVar3) {
        LOCK();
        (((QArrayData *)auVar16)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)auVar16)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QArrayData *)auVar16)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auVar16,2,0x10);
        }
      }
      if (&(local_e8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_e8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
        }
      }
      if ((QArrayData *)auStack_90._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_90._8_8_,2,0x10);
        }
      }
      if ((QArrayData *)auStack_a0._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_a0._0_8_,2,0x10);
        }
      }
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,2,0x10);
        }
      }
    }
  }
  if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,0x10);
    }
  }
  fileAdded = true;
LAB_00207f64:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return fileAdded;
  }
  __stack_chk_fail();
}

Assistant:

bool VCXProjectWriter::outputFileConfig(OutputFilterData *d, XmlOutput &xml, XmlOutput &xmlFilter,
                                        const QString &filename, const QString &fullFilterName,
                                        bool fileAdded, bool hasCustomBuildStep)
{
    VCFilter &filter = d->filter;
    if (d->inBuild) {
        if (filter.Project->usePCH)
            filter.modifyPCHstage(filename);
    } else {
        // Excluded files uses an empty compiler stage
        if (d->info.excludeFromBuild)
            filter.useCompilerTool = true;
    }

    // Actual XML output ----------------------------------
    if (hasCustomBuildStep || filter.useCustomBuildTool || filter.useCompilerTool
            || !d->inBuild || filter.Name.startsWith("Deployment Files")) {

        if (hasCustomBuildStep || filter.useCustomBuildTool)
        {
            if (!fileAdded) {
                fileAdded = true;

                xmlFilter << tag("CustomBuild")
                    << attrTag("Include", Option::fixPathToTargetOS(filename))
                    << attrTagS("Filter", fullFilterName);

                xml << tag("CustomBuild")
                    << attrTag("Include", Option::fixPathToTargetOS(filename));

                if (filter.Name.startsWith("Form Files")
                        || filter.Name.startsWith("Generated Files")
                        || filter.Name.startsWith("Resource Files")
                        || filter.Name.startsWith("Deployment Files"))
                    xml << attrTagS("FileType", "Document");
            }

            filter.Project->projectWriter->write(xml, filter.CustomBuildTool);
        }

        if (!fileAdded)
        {
            fileAdded = true;
            outputFileConfig(xml, xmlFilter, filename, fullFilterName);
        }

        const QString condition = generateCondition(*filter.Config);
        if (!d->inBuild) {
            xml << tag("ExcludedFromBuild")
                << attrTag("Condition", condition)
                << valueTag("true");
        }

        if (filter.Name.startsWith("Deployment Files") && d->inBuild) {
            xml << tag("DeploymentContent")
                << attrTag("Condition", condition)
                << valueTag("true");
        }

        if (filter.useCompilerTool) {

            if ( !filter.CompilerTool.ForcedIncludeFiles.isEmpty() ) {
                xml << tag("ForcedIncludeFiles")
                    << attrTag("Condition", condition)
                    << valueTagX(filter.CompilerTool.ForcedIncludeFiles);
            }

            if ( !filter.CompilerTool.PrecompiledHeaderThrough.isEmpty() ) {
                xml << tag("PrecompiledHeaderFile")
                    << attrTag("Condition", condition)
                    << valueTag(filter.CompilerTool.PrecompiledHeaderThrough);
            }

            if (filter.CompilerTool.UsePrecompiledHeader != pchUnset) {
                xml << tag("PrecompiledHeader")
                    << attrTag("Condition", condition)
                    << valueTag(toString(filter.CompilerTool.UsePrecompiledHeader));
            }
        }
    }

    return fileAdded;
}